

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  KeyInfo *pKVar3;
  bool bVar4;
  uint uVar5;
  u8 uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  Mem *pMem2;
  ulong uVar14;
  uint uVar15;
  UnpackedRecord *pUVar16;
  uint uVar17;
  uint uVar18;
  u32 serial_type;
  u32 szHdr1;
  Mem mem1;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  UnpackedRecord *local_90;
  u8 *local_88;
  double local_80;
  long local_78;
  long local_70;
  MemValue local_68;
  undefined2 local_60;
  u8 local_5e;
  uint local_5c;
  long local_58;
  sqlite3 *local_40;
  
  pMem2 = pPKey2->aMem;
  local_9c = nKey1;
  if (bSkip == 0) {
    if (*pKey1 < '\0') {
      bVar7 = sqlite3GetVarint32((uchar *)pKey1,&local_98);
      uVar14 = (ulong)bVar7;
    }
    else {
      uVar14 = 1;
      local_98 = (int)*pKey1;
    }
    uVar17 = 0;
    uVar15 = local_98;
  }
  else {
    if (*(char *)((long)pKey1 + 1) < '\0') {
      uVar6 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
      uVar14 = (ulong)(byte)(uVar6 + 1);
    }
    else {
      uVar14 = 2;
      local_68.nZero = (int)*(char *)((long)pKey1 + 1);
    }
    local_98 = (uint)*pKey1;
    if ((ulong)(uint)local_68.nZero < 0x80) {
      uVar15 = (uint)""[(uint)local_68.nZero];
    }
    else {
      uVar15 = local_68.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar17 = 1;
    uVar15 = uVar15 + local_98;
  }
  uVar5 = local_98;
  pUVar16 = (UnpackedRecord *)(ulong)uVar15;
  if (local_9c < uVar15) {
    iVar13 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13b66,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    pPKey2->errCode = '\v';
  }
  else {
    local_88 = &pPKey2->errCode;
    uVar15 = 0;
LAB_00177f1d:
    uVar2 = pMem2->flags;
    if ((uVar2 & 0x24) == 0) {
      if ((uVar2 & 8) != 0) {
        local_a0 = (uint)*(byte *)((long)pKey1 + uVar14);
        uVar10 = 1;
        if (9 < local_a0) goto LAB_00178383;
        uVar18 = (uint)*(byte *)((long)pKey1 + uVar14);
        if (uVar18 == 0) {
          uVar10 = 0xffffffff;
          goto LAB_00178383;
        }
        local_90 = pUVar16;
        sqlite3VdbeSerialGet
                  ((uchar *)(((ulong)pUVar16 & 0xffffffff) + (long)pKey1),uVar18,(Mem *)&local_68);
        dVar1 = (pMem2->u).r;
        pUVar16 = local_90;
        if (uVar18 != 7) {
          local_78 = CONCAT44(local_68.i._4_4_,local_68.nZero);
          local_80 = dVar1;
          uVar10 = (uint)(dVar1 < (double)local_78);
          if ((double)local_78 < dVar1) {
            uVar10 = 0xffffffff;
          }
          goto LAB_00178383;
        }
        if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) {
          uVar10 = 0xffffffff;
          goto LAB_00178383;
        }
        if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_00178383;
        goto LAB_00178380;
      }
      if ((uVar2 & 2) == 0) {
        uVar10 = (uint)*(byte *)((long)pKey1 + uVar14);
        if ((uVar2 & 0x10) == 0) {
          local_a0 = uVar10;
          uVar10 = (uint)(uVar10 != 0);
        }
        else {
          if ((char)*(byte *)((long)pKey1 + uVar14) < '\0') {
            sqlite3GetVarint32((uchar *)(uVar14 + (long)pKey1),&local_a0);
            uVar10 = local_a0;
          }
          local_a0 = uVar10;
          uVar10 = 0xffffffff;
          if ((local_a0 & 1) == 0 && 0xb < local_a0) {
            uVar10 = local_a0 - 0xc >> 1;
            uVar18 = (int)pUVar16 + uVar10;
            local_90 = pPKey2;
            if (local_9c < uVar18) {
              local_94 = 0;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13bd1,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              local_90->errCode = '\v';
            }
            else if ((pMem2->flags & 0x4000) == 0) {
              uVar15 = pMem2->n;
              uVar8 = uVar15;
              if ((int)uVar10 < (int)uVar15) {
                uVar8 = uVar10;
              }
              uVar8 = memcmp((void *)(((ulong)pUVar16 & 0xffffffff) + (long)pKey1),pMem2->z,
                             (long)(int)uVar8);
              uVar15 = uVar10 - uVar15;
              if (uVar8 != 0) {
                uVar15 = uVar8;
              }
            }
            else {
              if (local_a0 - 0xc != 0) {
                uVar12 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar12 + ((ulong)pUVar16 & 0xffffffff)) != '\0') {
                    uVar15 = 1;
                    goto LAB_00178492;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar10 != uVar12);
              }
              uVar15 = uVar10 - (pMem2->u).nZero;
            }
LAB_00178492:
            iVar13 = 1;
            pPKey2 = local_90;
            uVar10 = uVar15;
            if (local_9c < uVar18) goto LAB_00178415;
          }
        }
        goto LAB_00178383;
      }
      uVar10 = (int)*(char *)((long)pKey1 + uVar14);
      if (*(char *)((long)pKey1 + uVar14) < '\0') {
        sqlite3GetVarint32((uchar *)(uVar14 + (long)pKey1),&local_a0);
        uVar10 = local_a0;
      }
      local_a0 = uVar10;
      uVar10 = 0xffffffff;
      if ((local_a0 < 0xc) || (uVar10 = 1, (local_a0 & 1) == 0)) goto LAB_00178383;
      local_5c = local_a0 - 0xc >> 1;
      if ((local_5c + (int)pUVar16 <= local_9c) &&
         (pKVar3 = pPKey2->pKeyInfo, (int)uVar17 < (int)(uint)pKVar3->nAllField)) {
        if (pKVar3->aColl[(int)uVar17] == (CollSeq *)0x0) {
          uVar15 = pMem2->n;
          uVar10 = local_5c - uVar15;
          if ((int)local_5c < (int)uVar15) {
            uVar15 = local_5c;
          }
          uVar15 = memcmp((void *)(((ulong)pUVar16 & 0xffffffff) + (long)pKey1),pMem2->z,
                          (long)(int)uVar15);
          if (uVar15 != 0) {
            uVar10 = uVar15;
          }
        }
        else {
          local_5e = pKVar3->enc;
          local_40 = pKVar3->db;
          local_60 = 2;
          local_58 = ((ulong)pUVar16 & 0xffffffff) + (long)pKey1;
          uVar10 = vdbeCompareMemString((Mem *)&local_68,pMem2,pKVar3->aColl[(int)uVar17],local_88);
        }
        goto LAB_00178383;
      }
      local_94 = 0;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13bb3,
                  "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
      pPKey2->errCode = '\v';
      iVar13 = 1;
      goto LAB_00178415;
    }
    bVar7 = *(byte *)((long)pKey1 + uVar14);
    local_a0 = (uint)bVar7;
    uVar10 = 1;
    if (9 < local_a0) goto LAB_00178383;
    uVar18 = (uint)bVar7;
    uVar10 = 0xffffffff;
    if (uVar18 == 0) goto LAB_00178383;
    if (uVar18 == 7) {
      sqlite3VdbeSerialGet
                ((uchar *)(((ulong)pUVar16 & 0xffffffff) + (long)pKey1),7,(Mem *)&local_68);
      local_70 = (pMem2->u).i;
      uVar10 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_70);
      if ((double)local_70 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
        uVar10 = 1;
      }
      goto LAB_00178383;
    }
    if (5 < bVar7 - 1) {
      uVar12 = (ulong)(uVar18 - 8);
      goto LAB_00178372;
    }
    uVar9 = (ulong)pUVar16 & 0xffffffff;
    switch((uint)bVar7) {
    case 1:
      uVar12 = (ulong)*(char *)((long)pKey1 + uVar9);
      break;
    case 2:
      uVar11 = (long)*(char *)((long)pKey1 + uVar9) << 8;
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1);
      goto LAB_00178361;
    case 3:
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 8 |
               (long)*(char *)((long)pKey1 + uVar9) << 0x10;
      bVar7 = *(byte *)((long)pKey1 + uVar9 + 2);
      goto LAB_0017834d;
    case 4:
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 2) << 8 |
               (long)(int)((uint)*(byte *)((long)pKey1 + uVar9) << 0x18) |
               (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 0x10;
      bVar7 = *(byte *)((long)pKey1 + uVar9 + 3);
LAB_0017834d:
      uVar12 = bVar7 | uVar12;
      break;
    case 5:
      uVar18 = *(uint *)((long)pKey1 + uVar9 + 2);
      uVar11 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      uVar12 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar9),
                                          *(undefined1 *)((long)pKey1 + uVar9 + 1)) << 0x20;
LAB_00178361:
      uVar12 = uVar12 | uVar11;
      break;
    case 6:
      uVar12 = *(ulong *)((long)pKey1 + uVar9);
      uVar12 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
               | uVar12 << 0x38;
    }
LAB_00178372:
    if ((pMem2->u).i <= (long)uVar12) {
      if ((pMem2->u).i < (long)uVar12) {
        uVar15 = 1;
      }
LAB_00178380:
      uVar10 = uVar15;
    }
LAB_00178383:
    if (uVar10 == 0) {
      uVar17 = uVar17 + 1;
      if (uVar17 == pPKey2->nField) {
        uVar15 = 0;
        iVar13 = 2;
      }
      else {
        uVar12 = (ulong)local_a0;
        if (uVar12 < 0x80) {
          uVar10 = (uint)""[uVar12];
        }
        else {
          uVar10 = local_a0 - 0xc >> 1;
        }
        iVar13 = 1;
        if (0x7f < local_a0) {
          do {
            iVar13 = iVar13 + 1;
            bVar4 = 0x3fff < uVar12;
            uVar12 = uVar12 >> 7;
          } while (bVar4);
        }
        pMem2 = pMem2 + 1;
        uVar14 = (ulong)(uint)((int)uVar14 + iVar13);
        iVar13 = 0;
        uVar15 = 0;
        pUVar16 = (UnpackedRecord *)(ulong)(uVar10 + (int)pUVar16);
      }
    }
    else {
      local_94 = -uVar10;
      if (pPKey2->pKeyInfo->aSortOrder[(int)uVar17] == '\0') {
        local_94 = uVar10;
      }
      iVar13 = 1;
      uVar15 = local_94;
    }
LAB_00178415:
    if (iVar13 == 0) {
      if ((uVar5 <= (uint)uVar14) || (local_9c < (uint)pUVar16)) goto LAB_00178524;
      goto LAB_00177f1d;
    }
    if (iVar13 != 2) {
      return local_94;
    }
LAB_00178524:
    pPKey2->eqSeen = '\x01';
    iVar13 = (int)pPKey2->default_rc;
  }
  return iVar13;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}